

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O1

void __thiscall wasm::DAEFunctionInfo::clear(DAEFunctionInfo *this)

{
  DAEFunctionInfo local_138;
  
  memset(&local_138,0,0x108);
  local_138.stale = true;
  local_138.unusedParams.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_138.unusedParams.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_138.unusedParams.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_138.calls._M_h._M_buckets = &local_138.calls._M_h._M_single_bucket;
  local_138.calls._M_h._M_bucket_count = 1;
  local_138.calls._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_138.calls._M_h._M_element_count = 0;
  local_138.calls._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_138.calls._M_h._M_rehash_policy._M_next_resize = 0;
  local_138.calls._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_138.droppedCalls._M_h._M_buckets = &local_138.droppedCalls._M_h._M_single_bucket;
  local_138.droppedCalls._M_h._M_bucket_count = 1;
  local_138.droppedCalls._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_138.droppedCalls._M_h._M_element_count = 0;
  local_138.droppedCalls._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_138.tailCallees._M_h._M_buckets = &local_138.tailCallees._M_h._M_single_bucket;
  local_138.droppedCalls._M_h._M_rehash_policy._M_next_resize = 0;
  local_138.droppedCalls._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_138.hasTailCalls = false;
  local_138.tailCallees._M_h._M_bucket_count = 1;
  local_138.tailCallees._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_138.tailCallees._M_h._M_element_count = 0;
  local_138.tailCallees._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_138.tailCallees._M_h._M_rehash_policy._M_next_resize = 0;
  local_138.tailCallees._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_138.hasUnseenCalls._M_h._M_buckets = &local_138.hasUnseenCalls._M_h._M_single_bucket;
  local_138.hasUnseenCalls._M_h._M_bucket_count = 1;
  local_138.hasUnseenCalls._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_138.hasUnseenCalls._M_h._M_element_count = 0;
  local_138.hasUnseenCalls._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_138.hasUnseenCalls._M_h._M_rehash_policy._M_next_resize = 0;
  local_138.hasUnseenCalls._M_h._M_single_bucket = (__node_base_ptr)0x0;
  operator=(this,&local_138);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_138.hasUnseenCalls._M_h);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_138.tailCallees._M_h);
  std::
  _Hashtable<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_138.droppedCalls._M_h);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_138.calls._M_h);
  if (local_138.unusedParams.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.unusedParams.super_vector<unsigned_int,_std::allocator<unsigned_int>_>
                    .super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.unusedParams.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.unusedParams.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void clear() { *this = DAEFunctionInfo(); }